

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

Constraint *
slang::ast::ImplicationConstraint::fromSyntax
          (ImplicationConstraintSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  Compilation *compilation;
  undefined4 extraout_var;
  ConstraintItemSyntax *pCVar3;
  undefined4 extraout_var_00;
  ImplicationConstraint *pIVar4;
  socklen_t __len;
  ASTContext *in_RSI;
  ConstraintExprVisitor visitor;
  ImplicationConstraint *result;
  Constraint *body;
  Expression *pred;
  Compilation *comp;
  ConstraintExprVisitor *in_stack_ffffffffffffff98;
  ASTContext *args;
  ASTContext *in_stack_ffffffffffffffb0;
  bitmask<slang::ast::ASTFlags> local_30;
  undefined8 local_28;
  Compilation *local_20;
  ASTContext *local_18;
  ImplicationConstraint *local_8;
  
  local_18 = in_RSI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x87ba18);
  compilation = (Compilation *)
                not_null<slang::syntax::ExpressionSyntax_*>::operator*
                          ((not_null<slang::syntax::ExpressionSyntax_*> *)0x87ba2b);
  args = local_18;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,None);
  iVar2 = Expression::bind((int)compilation,(sockaddr *)args,(socklen_t)local_30.m_bits);
  local_28 = CONCAT44(extraout_var,iVar2);
  pCVar3 = not_null<slang::syntax::ConstraintItemSyntax_*>::operator*
                     ((not_null<slang::syntax::ConstraintItemSyntax_*> *)0x87ba6f);
  iVar2 = Constraint::bind((int)pCVar3,(sockaddr *)local_18,__len);
  pIVar4 = BumpAllocator::
           emplace<slang::ast::ImplicationConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&>
                     ((BumpAllocator *)in_stack_ffffffffffffffb0,(Expression *)args,
                      (Constraint *)compilation);
  bVar1 = Expression::bad((Expression *)compilation);
  if ((bVar1) || (bVar1 = Constraint::bad((Constraint *)CONCAT44(extraout_var_00,iVar2)), bVar1)) {
    local_8 = (ImplicationConstraint *)
              Constraint::badConstraint(compilation,(Constraint *)in_stack_ffffffffffffff98);
  }
  else {
    ConstraintExprVisitor::ConstraintExprVisitor
              ((ConstraintExprVisitor *)&stack0xffffffffffffffb0,local_18,false);
    bVar1 = Expression::visit<slang::ast::ConstraintExprVisitor&>
                      ((Expression *)compilation,in_stack_ffffffffffffff98);
    local_8 = pIVar4;
    if (!bVar1) {
      local_8 = (ImplicationConstraint *)
                Constraint::badConstraint(compilation,(Constraint *)in_stack_ffffffffffffff98);
    }
  }
  return &local_8->super_Constraint;
}

Assistant:

Constraint& ImplicationConstraint::fromSyntax(const ImplicationConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& pred = Expression::bind(*syntax.left, context);
    auto& body = Constraint::bind(*syntax.constraints, context);
    auto result = comp.emplace<ImplicationConstraint>(pred, body);
    if (pred.bad() || body.bad())
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, /* isSoft */ false);
    if (!pred.visit(visitor))
        return badConstraint(comp, result);

    return *result;
}